

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpm_codec.c
# Opt level: O0

UINT32 TSS_BuildCommand(TPM_CC cmdCode,TPM_HANDLE *handles,INT32 numHandles,TSS_SESSION **sessions,
                       INT32 numSessions,BYTE *params,INT32 paramsSize,BYTE *cmdBuffer,
                       INT32 bufCapacity)

{
  UINT16 UVar1;
  int local_60;
  UINT32 local_5c;
  int i_1;
  UINT32 authSize;
  BYTE *pAuthSize;
  int i;
  TPM_ST tag;
  BYTE *pCmdSize;
  BYTE *pBStack_38;
  UINT32 cmdSize;
  BYTE *params_local;
  TSS_SESSION **ppTStack_28;
  INT32 numSessions_local;
  TSS_SESSION **sessions_local;
  TPM_HANDLE *pTStack_18;
  INT32 numHandles_local;
  TPM_HANDLE *handles_local;
  TPM_CC cmdCode_local;
  
  pCmdSize._4_4_ = 0;
  _i = (BYTE *)0x0;
  pAuthSize._6_2_ = 0x8001;
  if (sessions != (TSS_SESSION **)0x0) {
    pAuthSize._6_2_ = 0x8002;
  }
  if ((((((cmdCode < 0x11f) || (0x193 < cmdCode)) ||
        ((handles == (TPM_HANDLE *)0x0 && (numHandles != 0)))) ||
       ((sessions == (TSS_SESSION **)0x0 && (numSessions != 0)))) ||
      ((params == (BYTE *)0x0 && (paramsSize != 0)))) ||
     (((bufCapacity < 0 || (cmdBuffer == (BYTE *)0x0)) || ((uint)bufCapacity < 10)))) {
    handles_local._4_4_ = 0;
  }
  else {
    pBStack_38 = params;
    params_local._4_4_ = numSessions;
    ppTStack_28 = sessions;
    sessions_local._4_4_ = numHandles;
    pTStack_18 = handles;
    handles_local._0_4_ = cmdCode;
    UVar1 = UINT16_Marshal((UINT16 *)((long)&pAuthSize + 6),&cmdBuffer,&bufCapacity);
    pCmdSize._4_4_ = UVar1 + pCmdSize._4_4_;
    _i = cmdBuffer;
    UVar1 = UINT32_Marshal((UINT32 *)((long)&pCmdSize + 4),&cmdBuffer,&bufCapacity);
    pCmdSize._4_4_ = UVar1 + pCmdSize._4_4_;
    UVar1 = UINT32_Marshal((UINT32 *)&handles_local,&cmdBuffer,&bufCapacity);
    pCmdSize._4_4_ = UVar1 + pCmdSize._4_4_;
    for (pAuthSize._0_4_ = 0; (int)pAuthSize < sessions_local._4_4_;
        pAuthSize._0_4_ = (int)pAuthSize + 1) {
      UVar1 = UINT32_Marshal(pTStack_18 + (int)pAuthSize,&cmdBuffer,&bufCapacity);
      pCmdSize._4_4_ = UVar1 + pCmdSize._4_4_;
    }
    if (0 < params_local._4_4_) {
      _i_1 = cmdBuffer;
      local_5c = 0;
      UVar1 = UINT32_Marshal(&local_5c,&cmdBuffer,&bufCapacity);
      pCmdSize._4_4_ = UVar1 + pCmdSize._4_4_;
      for (local_60 = 0; local_60 < params_local._4_4_; local_60 = local_60 + 1) {
        UVar1 = TPMS_AUTH_COMMAND_Marshal(&ppTStack_28[local_60]->SessIn,&cmdBuffer,&bufCapacity);
        local_5c = UVar1 + local_5c;
      }
      pCmdSize._4_4_ = local_5c + pCmdSize._4_4_;
      UINT32_Marshal(&local_5c,(BYTE **)&i_1,(INT32 *)0x0);
    }
    if ((pBStack_38 != (BYTE *)0x0) && (paramsSize != 0)) {
      UVar1 = BYTE_Array_Marshal(pBStack_38,&cmdBuffer,&bufCapacity,paramsSize);
      pCmdSize._4_4_ = UVar1 + pCmdSize._4_4_;
    }
    UINT32_Marshal((UINT32 *)((long)&pCmdSize + 4),(BYTE **)&i,(INT32 *)0x0);
    handles_local._4_4_ = pCmdSize._4_4_;
  }
  return handles_local._4_4_;
}

Assistant:

UINT32
TSS_BuildCommand(
    TPM_CC           cmdCode,       // IN: Command code
    TPM_HANDLE      *handles,       // IN (opt): Array of handles used by the command
    INT32            numHandles,    // IN: Number of handles in 'handles'
    TSS_SESSION    **sessions,      // IN (opt): Array of sessions
    INT32            numSessions,   // IN: Number of sessions in 'sessions'
    BYTE            *params,        // IN (opt): Marshaled command parameters
    INT32            paramsSize,    // IN: Size of 'params' in bytes
    BYTE            *cmdBuffer,     // OUT: Command buffer ready for sending to TPM
    INT32            bufCapacity    // IN: Capacity of 'cmdBuffer' in bytes
)
{
    UINT32  cmdSize = 0;
    BYTE   *pCmdSize = NULL;
    TPM_ST  tag = sessions ? TPM_ST_SESSIONS : TPM_ST_NO_SESSIONS;

    if ((cmdCode < 0x0000011f || cmdCode > 0x00000193)
        || (!handles && numHandles)
        || (!sessions && numSessions)
        || (!params && paramsSize)
        || (bufCapacity < 0)
        || (!cmdBuffer || (((UINT32)bufCapacity) < STD_RESPONSE_HEADER)))
    {
        return 0;
    }

    //
    // Marshal command header
    //

    cmdSize += TPMI_ST_COMMAND_TAG_Marshal(&tag, &cmdBuffer, &bufCapacity);

    // Do not know the final size of the command buffer yet.
    // Remeber the place to marshal it, and reserve space in the command buffer.
    pCmdSize = cmdBuffer;
    cmdSize += UINT32_Marshal((UINT32*)&cmdSize, &cmdBuffer, &bufCapacity);

    cmdSize += TPM_CC_Marshal(&cmdCode, &cmdBuffer, &bufCapacity);

    //
    // Marshal handles, if any
    //
    for (int i = 0; i < numHandles; i++)
    {
        cmdSize += TPM_HANDLE_Marshal(handles + i, &cmdBuffer, &bufCapacity);
    }
    // cmdSize = 14
    // bufCapacity - 4082

    //
    // Marshal sessions, if any
    //
    if (numSessions > 0)
    {
        // Do not know the size of the authorization area yet.
        // Remeber the place to marshal it, and marshal a placeholder value for now.
        BYTE   *pAuthSize = cmdBuffer; //t-sdks-
        UINT32  authSize = 0;

        // cmdSize - 14
        cmdSize += UINT32_Marshal((UINT32*)&authSize, &cmdBuffer, &bufCapacity);
        // cmdSize - 18

        // Marshal the sessions
        for (int i = 0; i < numSessions; i++)
        {
            authSize += TPMS_AUTH_COMMAND_Marshal(&sessions[i]->SessIn, &cmdBuffer, &bufCapacity);
        }
        // CmdBuffer - zure-devices.net/devices/jebrandoDevice/n1491340412

        // Update total marshaled size
        // 18 += 9;
        cmdSize += authSize;
        // 27

        // And marshal auth area size into the reserved space
        UINT32_Marshal((UINT32*)&authSize, &pAuthSize, NULL);
        // zure-devices.net/devices/jebrandoDevice
    }

    //
    // Marshal parameters, if any
    //
    if (params && paramsSize)
    {
        // 27
        cmdSize += BYTE_Array_Marshal(params, &cmdBuffer, &bufCapacity, paramsSize);
    }

    // Finally marshal total command size into the reserved space
    UINT32_Marshal((UINT32*)&cmdSize, &pCmdSize, NULL);

    return cmdSize;
}